

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_auth_client.c
# Opt level: O0

CREDENTIAL_RESULT *
iothub_device_auth_generate_credentials
          (IOTHUB_SECURITY_HANDLE handle,DEVICE_AUTH_CREDENTIAL_INFO *dev_auth_cred)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  LOGGER_LOG p_Var4;
  STRING_HANDLE handle_00;
  STRING_HANDLE handle_01;
  char *pcVar5;
  char *pcVar6;
  LOGGER_LOG l_15;
  LOGGER_LOG l_14;
  LOGGER_LOG l_13;
  LOGGER_LOG l_12;
  LOGGER_LOG l_11;
  char *temp_sas_token;
  LOGGER_LOG l_10;
  LOGGER_LOG l_9;
  LOGGER_LOG l_8;
  STRING_HANDLE url_encoded;
  STRING_HANDLE sas_token_handle;
  char *skn_value;
  char *skn_key;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  STRING_HANDLE signature;
  STRING_HANDLE urlEncodedSignature;
  LOGGER_LOG l_5;
  size_t total_len;
  size_t data_len;
  uchar *data_value;
  LOGGER_LOG l_4;
  char *payload;
  size_t len;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  char expire_token [64];
  LOGGER_LOG l;
  CREDENTIAL_RESULT *result;
  DEVICE_AUTH_CREDENTIAL_INFO *dev_auth_cred_local;
  IOTHUB_SECURITY_HANDLE handle_local;
  
  if (handle == (IOTHUB_SECURITY_HANDLE)0x0) {
    expire_token._56_8_ = xlogging_get_log_function();
    if ((LOGGER_LOG)expire_token._56_8_ != (LOGGER_LOG)0x0) {
      (*(code *)expire_token._56_8_)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                 ,"iothub_device_auth_generate_credentials",0x114,1,
                 "Invalid handle parameter: handle");
    }
    l = (LOGGER_LOG)0x0;
  }
  else if ((handle->cred_type == AUTH_TYPE_SAS) || (handle->cred_type == AUTH_TYPE_SYMM_KEY)) {
    memset(&l_1,0,0x40);
    if (handle->sas_token != (char *)0x0) {
      free(handle->sas_token);
      handle->sas_token = (char *)0x0;
    }
    if ((dev_auth_cred == (DEVICE_AUTH_CREDENTIAL_INFO *)0x0) ||
       ((dev_auth_cred->sas_info).token_scope == (char *)0x0)) {
      l_2 = xlogging_get_log_function();
      if (l_2 != (LOGGER_LOG)0x0) {
        (*l_2)(AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
               ,"iothub_device_auth_generate_credentials",0x123,1,
               "Invalid handle parameter: dev_auth_cred");
      }
      l = (LOGGER_LOG)0x0;
    }
    else if ((dev_auth_cred->dev_auth_type == AUTH_TYPE_SAS) ||
            (dev_auth_cred->dev_auth_type == AUTH_TYPE_SYMM_KEY)) {
      iVar1 = size_tToString((char *)&l_1,0x40,(dev_auth_cred->sas_info).expiry_seconds);
      if (iVar1 == 0) {
        sVar2 = strlen((dev_auth_cred->sas_info).token_scope);
        sVar3 = strlen((char *)&l_1);
        payload = (char *)(sVar2 + sVar3 + 3);
        l_4 = (LOGGER_LOG)malloc(sVar2 + sVar3 + 4);
        if (l_4 == (LOGGER_LOG)0x0) {
          l = (LOGGER_LOG)0x0;
          data_value = (uchar *)xlogging_get_log_function();
          if ((LOGGER_LOG)data_value != (LOGGER_LOG)0x0) {
            (*(code *)data_value)
                      (AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                       ,"iothub_device_auth_generate_credentials",0x137,1,
                       "Failure allocating payload.");
          }
        }
        else {
          iVar1 = sprintf((char *)l_4,"%s\n%s",(dev_auth_cred->sas_info).token_scope,&l_1);
          if (iVar1 == 0) {
            l = (LOGGER_LOG)0x0;
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                        ,"iothub_device_auth_generate_credentials",0x142,1,
                        "Failure constructing hash payload.");
            }
          }
          else {
            iVar1 = sign_sas_data(handle,(char *)l_4,(uchar **)&data_len,&total_len);
            if (iVar1 == 0) {
              if ((handle->base64_encode_signature & 1U) == 1) {
                l_6 = (LOGGER_LOG)Azure_Base64_Encode_Bytes((uchar *)data_len,total_len);
              }
              else {
                l_6 = (LOGGER_LOG)STRING_construct((char *)data_len);
              }
              if (l_6 == (LOGGER_LOG)0x0) {
                l = (LOGGER_LOG)0x0;
                p_Var4 = xlogging_get_log_function();
                if (p_Var4 != (LOGGER_LOG)0x0) {
                  (*p_Var4)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                            ,"iothub_device_auth_generate_credentials",0x154,1,
                            "Failure constructing encoding.");
                }
              }
              else {
                handle_00 = URL_Encode((STRING_HANDLE)l_6);
                if (handle_00 == (STRING_HANDLE)0x0) {
                  l = (LOGGER_LOG)0x0;
                  p_Var4 = xlogging_get_log_function();
                  if (p_Var4 != (LOGGER_LOG)0x0) {
                    (*p_Var4)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                              ,"iothub_device_auth_generate_credentials",0x159,1,
                              "Failure constructing url Signature.");
                  }
                  STRING_delete((STRING_HANDLE)l_6);
                }
                else {
                  skn_value = "";
                  sas_token_handle = (STRING_HANDLE)0x1a5540;
                  if (((dev_auth_cred->sas_info).key_name != (char *)0x0) &&
                     (sVar2 = strlen((dev_auth_cred->sas_info).key_name), sVar2 != 0)) {
                    skn_value = "&skn=";
                    sas_token_handle = (STRING_HANDLE)(dev_auth_cred->sas_info).key_name;
                  }
                  url_encoded = (STRING_HANDLE)0x0;
                  if ((handle->urlencode_token_scope & 1U) == 1) {
                    handle_01 = URL_EncodeString((dev_auth_cred->sas_info).token_scope);
                    if (handle_01 == (STRING_HANDLE)0x0) {
                      p_Var4 = xlogging_get_log_function();
                      if (p_Var4 != (LOGGER_LOG)0x0) {
                        (*p_Var4)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                                  ,"iothub_device_auth_generate_credentials",0x16f,1,
                                  "failed to url string %s",(dev_auth_cred->sas_info).token_scope);
                      }
                    }
                    else {
                      pcVar6 = STRING_c_str(handle_01);
                      pcVar5 = STRING_c_str(handle_00);
                      url_encoded = STRING_construct_sprintf
                                              ("SharedAccessSignature sr=%s&sig=%s&se=%s%s%s",pcVar6
                                               ,pcVar5,&l_1,skn_value,sas_token_handle);
                    }
                    STRING_delete(handle_01);
                  }
                  else {
                    pcVar6 = (dev_auth_cred->sas_info).token_scope;
                    pcVar5 = STRING_c_str(handle_00);
                    url_encoded = STRING_construct_sprintf
                                            ("SharedAccessSignature sr=%s&sig=%s&se=%s%s%s",pcVar6,
                                             pcVar5,&l_1,skn_value,sas_token_handle);
                  }
                  if (url_encoded == (STRING_HANDLE)0x0) {
                    l = (LOGGER_LOG)0x0;
                    p_Var4 = xlogging_get_log_function();
                    if (p_Var4 != (LOGGER_LOG)0x0) {
                      (*p_Var4)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                                ,"iothub_device_auth_generate_credentials",0x180,1,
                                "Failure constructing url Signature.");
                    }
                  }
                  else {
                    l = (LOGGER_LOG)malloc(0x18);
                    if (l == (LOGGER_LOG)0x0) {
                      STRING_delete(url_encoded);
                      p_Var4 = xlogging_get_log_function();
                      if (p_Var4 != (LOGGER_LOG)0x0) {
                        (*p_Var4)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                                  ,"iothub_device_auth_generate_credentials",0x185,1,
                                  "Failure allocating credential result.");
                      }
                    }
                    else {
                      pcVar6 = STRING_c_str(url_encoded);
                      iVar1 = mallocAndStrcpy_s(&handle->sas_token,pcVar6);
                      if (iVar1 == 0) {
                        *(char **)(l + 8) = handle->sas_token;
                      }
                      else {
                        free(l);
                        l = (LOGGER_LOG)0x0;
                        p_Var4 = xlogging_get_log_function();
                        if (p_Var4 != (LOGGER_LOG)0x0) {
                          (*p_Var4)(AZ_LOG_ERROR,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                                    ,"iothub_device_auth_generate_credentials",0x18e,1,
                                    "Failure allocating and copying string.");
                        }
                      }
                      STRING_delete(url_encoded);
                    }
                  }
                  STRING_delete((STRING_HANDLE)l_6);
                  STRING_delete(handle_00);
                }
              }
              free((void *)data_len);
            }
            else {
              l = (LOGGER_LOG)0x0;
              p_Var4 = xlogging_get_log_function();
              if (p_Var4 != (LOGGER_LOG)0x0) {
                (*p_Var4)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                          ,"iothub_device_auth_generate_credentials",0x19e,1,
                          "Failure generate hash from tpm.");
              }
            }
          }
          free(l_4);
        }
      }
      else {
        l = (LOGGER_LOG)0x0;
        len = (size_t)xlogging_get_log_function();
        if ((LOGGER_LOG)len != (LOGGER_LOG)0x0) {
          (*(code *)len)(AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                         ,"iothub_device_auth_generate_credentials",0x12e,1,
                         "Failure creating expire token");
        }
      }
    }
    else {
      l_3 = xlogging_get_log_function();
      if (l_3 != (LOGGER_LOG)0x0) {
        (*l_3)(AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
               ,"iothub_device_auth_generate_credentials",0x128,1,
               "Invalid handle parameter: dev_auth_cred.dev_auth_type");
      }
      l = (LOGGER_LOG)0x0;
    }
  }
  else {
    if (handle->x509_certificate != (char *)0x0) {
      free(handle->x509_certificate);
      handle->x509_certificate = (char *)0x0;
    }
    if (handle->x509_alias_key != (char *)0x0) {
      free(handle->x509_alias_key);
      handle->x509_alias_key = (char *)0x0;
    }
    l = (LOGGER_LOG)malloc(0x18);
    if (l == (LOGGER_LOG)0x0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                  ,"iothub_device_auth_generate_credentials",0x1b3,1,
                  "Failure allocating credential result.");
      }
    }
    else {
      pcVar6 = (*handle->hsm_client_get_cert)(handle->hsm_client_handle);
      handle->x509_certificate = pcVar6;
      if (pcVar6 == (char *)0x0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                    ,"iothub_device_auth_generate_credentials",0x1b7,1,
                    "Failure allocating device credential result.");
        }
        free(l);
        l = (LOGGER_LOG)0x0;
      }
      else {
        pcVar6 = (*handle->hsm_client_get_alias_key)(handle->hsm_client_handle);
        handle->x509_alias_key = pcVar6;
        if (pcVar6 == (char *)0x0) {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/provisioning_client/src/iothub_auth_client.c"
                      ,"iothub_device_auth_generate_credentials",0x1bd,1,
                      "Failure allocating device credential result.");
          }
          free(handle->x509_certificate);
          handle->x509_certificate = (char *)0x0;
          free(l);
          l = (LOGGER_LOG)0x0;
        }
        else {
          *(char **)(l + 8) = handle->x509_certificate;
          *(char **)(l + 0x10) = handle->x509_alias_key;
        }
      }
    }
  }
  return (CREDENTIAL_RESULT *)l;
}

Assistant:

CREDENTIAL_RESULT* iothub_device_auth_generate_credentials(IOTHUB_SECURITY_HANDLE handle, const DEVICE_AUTH_CREDENTIAL_INFO* dev_auth_cred)
{
    CREDENTIAL_RESULT* result;
    if (handle == NULL)
    {
        LogError("Invalid handle parameter: handle");
        result = NULL;
    }
    else
    {
        if (handle->cred_type == AUTH_TYPE_SAS || handle->cred_type == AUTH_TYPE_SYMM_KEY)
        {
            char expire_token[64] = { 0 };
            if (handle->sas_token != NULL)
            {
                free(handle->sas_token);
                handle->sas_token = NULL;
            }
            if (dev_auth_cred == NULL || dev_auth_cred->sas_info.token_scope == NULL)
            {
                LogError("Invalid handle parameter: dev_auth_cred");
                result = NULL;
            }
            else if (dev_auth_cred->dev_auth_type != AUTH_TYPE_SAS && dev_auth_cred->dev_auth_type != AUTH_TYPE_SYMM_KEY)
            {
                LogError("Invalid handle parameter: dev_auth_cred.dev_auth_type");
                result = NULL;
            }
            else if (size_tToString(expire_token, sizeof(expire_token), (size_t)dev_auth_cred->sas_info.expiry_seconds) != 0)
            {
                result = NULL;
                LogError("Failure creating expire token");
            }
            else
            {
                size_t len = strlen(dev_auth_cred->sas_info.token_scope)+strlen(expire_token)+3;
                char* payload = malloc(len+1);
                if (payload == NULL)
                {
                    result = NULL;
                    LogError("Failure allocating payload.");
                }
                else
                {
                    unsigned char* data_value;
                    size_t data_len;

                    size_t total_len = sprintf(payload, "%s\n%s", dev_auth_cred->sas_info.token_scope, expire_token);
                    if (total_len <= 0)
                    {
                        result = NULL;
                        LogError("Failure constructing hash payload.");
                    }
                    else if (sign_sas_data(handle, payload, &data_value, &data_len) == 0)
                    {
                        STRING_HANDLE urlEncodedSignature = NULL;
                        STRING_HANDLE signature = NULL;
                        if (handle->base64_encode_signature == true)
                        {
                            signature = Azure_Base64_Encode_Bytes(data_value, data_len);
                        }
                        else
                        {
                            signature = STRING_construct((const char*)data_value);
                        }

                        if (signature == NULL)
                        {
                            result = NULL;
                            LogError("Failure constructing encoding.");
                        }
                        else if ((urlEncodedSignature = URL_Encode(signature)) == NULL)
                        {
                            result = NULL;
                            LogError("Failure constructing url Signature.");
                            STRING_delete(signature);
                        }
                        else
                        {
                            const char* skn_key = "";
                            const char* skn_value = "";

                            if ((dev_auth_cred->sas_info.key_name != NULL) && (strlen(dev_auth_cred->sas_info.key_name) > 0))
                            {
                                // If the key name is valid then add to the sas token
                                skn_key = SKN_SECTION_FORMAT;
                                skn_value = dev_auth_cred->sas_info.key_name;
                            }

                            STRING_HANDLE sas_token_handle = NULL;

                            if (handle->urlencode_token_scope == true)
                            {
                                STRING_HANDLE url_encoded = URL_EncodeString(dev_auth_cred->sas_info.token_scope);
                                if (url_encoded == NULL)
                                {
                                    LogError("failed to url string %s", dev_auth_cred->sas_info.token_scope);
                                }
                                else
                                {
                                    sas_token_handle = STRING_construct_sprintf(SAS_TOKEN_FORMAT, STRING_c_str(url_encoded), STRING_c_str(urlEncodedSignature), expire_token, skn_key, skn_value);
                                }

                                STRING_delete(url_encoded);
                            }
                            else
                            {
                                sas_token_handle = STRING_construct_sprintf(SAS_TOKEN_FORMAT, dev_auth_cred->sas_info.token_scope, STRING_c_str(urlEncodedSignature), expire_token, skn_key, skn_value);
                            }

                            if (sas_token_handle == NULL)
                            {
                                result = NULL;
                                LogError("Failure constructing url Signature.");
                            }
                            else if ((result = malloc(sizeof(CREDENTIAL_RESULT))) == NULL)
                            {
                                STRING_delete(sas_token_handle);
                                LogError("Failure allocating credential result.");
                            }
                            else
                            {
                                const char* temp_sas_token = STRING_c_str(sas_token_handle);
                                if (mallocAndStrcpy_s(&handle->sas_token, temp_sas_token) != 0)
                                {
                                    free(result);
                                    result = NULL;
                                    LogError("Failure allocating and copying string.");
                                }
                                else
                                {
                                    result->auth_cred_result.sas_result.sas_token = handle->sas_token;
                                }
                                STRING_delete(sas_token_handle);
                            }
                            STRING_delete(signature);
                            STRING_delete(urlEncodedSignature);
                        }
                        free(data_value);
                    }
                    else
                    {
                        result = NULL;
                        LogError("Failure generate hash from tpm.");
                    }
                    free(payload);
                }
            }
        }
        else
        {
            if (handle->x509_certificate != NULL)
            {
                free(handle->x509_certificate);
                handle->x509_certificate = NULL;
            }
            if (handle->x509_alias_key != NULL)
            {
                free(handle->x509_alias_key);
                handle->x509_alias_key = NULL;
            }

            if ((result = malloc(sizeof(CREDENTIAL_RESULT))) == NULL)
            {
                LogError("Failure allocating credential result.");
            }
            else if ((handle->x509_certificate = handle->hsm_client_get_cert(handle->hsm_client_handle)) == NULL)
            {
                LogError("Failure allocating device credential result.");
                free(result);
                result = NULL;
            }
            else if ((handle->x509_alias_key = handle->hsm_client_get_alias_key(handle->hsm_client_handle)) == NULL)
            {
                LogError("Failure allocating device credential result.");
                free(handle->x509_certificate);
                handle->x509_certificate = NULL;
                free(result);
                result = NULL;
            }
            else
            {
                result->auth_cred_result.x509_result.x509_cert = handle->x509_certificate;
                result->auth_cred_result.x509_result.x509_alias_key = handle->x509_alias_key;
            }
        }
    }
    return result;
}